

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_save(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *in_RAX;
  char *pcVar2;
  FString fname;
  
  fname.Chars = in_RAX;
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    iVar1 = FCommandLine::argc(argv);
    if (iVar1 < 4) {
      pcVar2 = FCommandLine::operator[](argv,1);
      FString::FString(&fname,pcVar2);
      DefaultExtension(&fname,".zds");
      iVar1 = FCommandLine::argc(argv);
      pcVar2 = FCommandLine::operator[](argv,(2 < iVar1) + 1);
      G_SaveGame(fname.Chars,pcVar2);
      FString::~FString(&fname);
      return;
    }
  }
  Printf("usage: save <filename> [description]\n");
  return;
}

Assistant:

CCMD (save)
{
    if (argv.argc() < 2 || argv.argc() > 3)
	{
        Printf ("usage: save <filename> [description]\n");
        return;
    }
    FString fname = argv[1];
	DefaultExtension (fname, "." SAVEGAME_EXT);
	G_SaveGame (fname, argv.argc() > 2 ? argv[2] : argv[1]);
}